

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall DPSprite::DPSprite(DPSprite *this,player_t *owner,AActor *caller,int id)

{
  TObjPtr<DPSprite> *obj;
  bool bVar1;
  DPSprite *pointed;
  DPSprite *pDVar2;
  AActor *pAVar3;
  TObjPtr<DPSprite> *obj_00;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f69b8;
  this->x = 0.0;
  this->y = 0.0;
  this->oldx = 0.0;
  this->oldy = 0.0;
  this->firstTic = true;
  this->Flags = 0;
  (this->Caller).field_0.p = caller;
  obj = &this->Next;
  this->Owner = owner;
  this->Sprite = 0;
  this->ID = id;
  this->processPending = true;
  obj_00 = &owner->psprites;
  pDVar2 = (DPSprite *)0x0;
  while ((pointed = GC::ReadBarrier<DPSprite>((DPSprite **)obj_00), pointed != (DPSprite *)0x0 &&
         (pointed->ID < this->ID))) {
    obj_00 = &pointed->Next;
    pDVar2 = pointed;
  }
  (this->Next).field_0.p = pointed;
  GC::WriteBarrier(&this->super_DObject,&pointed->super_DObject);
  if (pDVar2 == (DPSprite *)0x0) {
    (this->Owner->psprites).field_0.p = this;
    GC::WriteBarrier(&this->super_DObject);
  }
  else {
    (pDVar2->Next).field_0.p = this;
    GC::WriteBarrier(&pDVar2->super_DObject,&this->super_DObject);
  }
  pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
  if ((pDVar2 != (DPSprite *)0x0) &&
     (pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)obj), this->ID != 0 && pDVar2->ID == this->ID)
     ) {
    pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
    (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->Caller);
  bVar1 = DObject::IsKindOf((DObject *)pAVar3,AWeapon::RegistrationInfo.MyClass);
  if (!bVar1) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->Caller);
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      return;
    }
  }
  this->Flags = 0xf;
  return;
}

Assistant:

DPSprite::DPSprite(player_t *owner, AActor *caller, int id)
: x(.0), y(.0),
  oldx(.0), oldy(.0),
  firstTic(true),
  Sprite(0),
  Flags(0),
  Caller(caller),
  Owner(owner),
  ID(id),
  processPending(true)
{
	DPSprite *prev = nullptr;
	DPSprite *next = Owner->psprites;
	while (next != nullptr && next->ID < ID)
	{
		prev = next;
		next = next->Next;
	}
	Next = next;
	GC::WriteBarrier(this, next);
	if (prev == nullptr)
	{
		Owner->psprites = this;
		GC::WriteBarrier(this);
	}
	else
	{
		prev->Next = this;
		GC::WriteBarrier(prev, this);
	}

	if (Next && Next->ID == ID && ID != 0)
		Next->Destroy(); // Replace it.

	if (Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) || Caller->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
		Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_POWDOUBLE|PSPF_CVARFAST);
}